

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void rchold(double *A,int N,int stride,double *U22)

{
  long lVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  double *local_40;
  
  lVar3 = (long)stride;
  iVar10 = N + -1;
  uVar11 = iVar10 * iVar10;
  iVar5 = N * -2 + 3;
  local_40 = A + lVar3 + 1;
  while (N != 1) {
    dVar2 = *A;
    if (1 < N) {
      uVar4 = 1;
      do {
        A[uVar4] = A[uVar4] / dVar2;
        uVar4 = uVar4 + 1;
      } while ((uint)N != uVar4);
    }
    mmult(A + 1,A + 1,U22,N - 1U,1,N - 1U);
    uVar6 = N - 1;
    if (uVar6 != 0) {
      uVar4 = 0;
      do {
        U22[uVar4] = U22[uVar4] * dVar2;
        uVar4 = uVar4 + 1;
      } while (uVar11 != uVar4);
    }
    if (1 < N) {
      uVar4 = 0;
      pdVar7 = local_40;
      pdVar8 = U22;
      do {
        lVar9 = 0;
        do {
          pdVar7[lVar9] = pdVar7[lVar9] - pdVar8[lVar9];
          lVar1 = uVar4 + lVar9;
          lVar9 = lVar9 + 1;
        } while (lVar1 + 1 < (long)(int)uVar6);
        uVar4 = uVar4 + 1;
        pdVar8 = pdVar8 + (long)iVar10 + 1;
        pdVar7 = pdVar7 + lVar3 + 1;
      } while (uVar4 != uVar6);
    }
    A = A + lVar3 + 1;
    uVar11 = uVar11 + iVar5;
    iVar5 = iVar5 + 2;
    iVar10 = iVar10 + -1;
    local_40 = local_40 + lVar3 + 1;
    N = uVar6;
  }
  return;
}

Assistant:

static void rchold(double *A,int N, int stride, double *U22) {
	int j,i,u,w;
	double d1;
	
	if (N == 1) {
		return;
	} else {
		d1 = A[0];
		for (j = 1; j < N;++j) {
			A[j] /= d1;
		}
		mmult(A+1,A+1,U22,N-1,1,N-1);
		scale(U22,N-1,N-1,d1);
		for (i = 0; i < N-1; ++i) {
			u = stride + 1+ i * stride;
			w = i * (N-1);
			for(j = i; j < N-1;j++) {
				A[j + u] -= U22[j + w];
			}
		}
		
		rchold(A+stride+1,N-1,stride,U22);
	
	}
		
}